

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ActivationParams::ActivationParams
          (ActivationParams *this,ActivationParams *from)

{
  uint32 uVar1;
  void *pvVar2;
  ActivationParametricSoftplus *this_00;
  ActivationParametricSoftplus *from_00;
  ActivationLeakyReLU *this_01;
  ActivationLeakyReLU *from_01;
  ActivationELU *this_02;
  ActivationELU *from_02;
  ActivationReLU *this_03;
  ActivationReLU *from_03;
  ActivationPReLU *this_04;
  ActivationPReLU *from_04;
  ActivationSoftplus *this_05;
  ActivationSoftplus *from_05;
  ActivationSoftsign *this_06;
  ActivationSoftsign *from_06;
  ActivationScaledTanh *this_07;
  ActivationScaledTanh *from_07;
  ActivationSigmoidHard *this_08;
  ActivationSigmoidHard *from_08;
  ActivationLinear *this_09;
  ActivationLinear *from_09;
  ActivationSigmoid *this_10;
  ActivationSigmoid *from_10;
  ActivationThresholdedReLU *this_11;
  ActivationThresholdedReLU *from_11;
  ActivationTanh *this_12;
  ActivationTanh *from_12;
  double __x;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ActivationParams_00341b58;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 5) {
    this_09 = mutable_linear(this);
    from_09 = linear(from);
    ActivationLinear::MergeFrom(this_09,from_09);
  }
  else if (uVar1 == 10) {
    this_03 = mutable_relu(this);
    from_03 = relu(from);
    ActivationReLU::MergeFrom(this_03,from_03);
  }
  else if (uVar1 == 0xf) {
    this_01 = mutable_leakyrelu(this);
    from_01 = leakyrelu(from);
    ActivationLeakyReLU::MergeFrom(this_01,from_01);
  }
  else if (uVar1 == 0x14) {
    this_11 = mutable_thresholdedrelu(this);
    from_11 = thresholdedrelu(from);
    ActivationThresholdedReLU::MergeFrom(this_11,from_11);
  }
  else if (uVar1 == 0x19) {
    this_04 = mutable_prelu(this);
    from_04 = prelu(from);
    ActivationPReLU::MergeFrom(this_04,from_04);
  }
  else if (uVar1 == 0x1e) {
    this_12 = mutable_tanh(this);
    tanh(from,__x);
    ActivationTanh::MergeFrom(this_12,from_12);
  }
  else if (uVar1 == 0x1f) {
    this_07 = mutable_scaledtanh(this);
    from_07 = scaledtanh(from);
    ActivationScaledTanh::MergeFrom(this_07,from_07);
  }
  else if (uVar1 == 0x28) {
    this_10 = mutable_sigmoid(this);
    from_10 = sigmoid(from);
    ActivationSigmoid::MergeFrom(this_10,from_10);
  }
  else if (uVar1 == 0x29) {
    this_08 = mutable_sigmoidhard(this);
    from_08 = sigmoidhard(from);
    ActivationSigmoidHard::MergeFrom(this_08,from_08);
  }
  else if (uVar1 == 0x32) {
    this_02 = mutable_elu(this);
    from_02 = elu(from);
    ActivationELU::MergeFrom(this_02,from_02);
  }
  else if (uVar1 == 0x3c) {
    this_06 = mutable_softsign(this);
    from_06 = softsign(from);
    ActivationSoftsign::MergeFrom(this_06,from_06);
  }
  else if (uVar1 == 0x46) {
    this_05 = mutable_softplus(this);
    from_05 = softplus(from);
    ActivationSoftplus::MergeFrom(this_05,from_05);
  }
  else if (uVar1 == 0x47) {
    this_00 = mutable_parametricsoftplus(this);
    from_00 = parametricsoftplus(from);
    ActivationParametricSoftplus::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

ActivationParams::ActivationParams(const ActivationParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_NonlinearityType();
  switch (from.NonlinearityType_case()) {
    case kLinear: {
      mutable_linear()->::CoreML::Specification::ActivationLinear::MergeFrom(from.linear());
      break;
    }
    case kReLU: {
      mutable_relu()->::CoreML::Specification::ActivationReLU::MergeFrom(from.relu());
      break;
    }
    case kLeakyReLU: {
      mutable_leakyrelu()->::CoreML::Specification::ActivationLeakyReLU::MergeFrom(from.leakyrelu());
      break;
    }
    case kThresholdedReLU: {
      mutable_thresholdedrelu()->::CoreML::Specification::ActivationThresholdedReLU::MergeFrom(from.thresholdedrelu());
      break;
    }
    case kPReLU: {
      mutable_prelu()->::CoreML::Specification::ActivationPReLU::MergeFrom(from.prelu());
      break;
    }
    case kTanh: {
      mutable_tanh()->::CoreML::Specification::ActivationTanh::MergeFrom(from.tanh());
      break;
    }
    case kScaledTanh: {
      mutable_scaledtanh()->::CoreML::Specification::ActivationScaledTanh::MergeFrom(from.scaledtanh());
      break;
    }
    case kSigmoid: {
      mutable_sigmoid()->::CoreML::Specification::ActivationSigmoid::MergeFrom(from.sigmoid());
      break;
    }
    case kSigmoidHard: {
      mutable_sigmoidhard()->::CoreML::Specification::ActivationSigmoidHard::MergeFrom(from.sigmoidhard());
      break;
    }
    case kELU: {
      mutable_elu()->::CoreML::Specification::ActivationELU::MergeFrom(from.elu());
      break;
    }
    case kSoftsign: {
      mutable_softsign()->::CoreML::Specification::ActivationSoftsign::MergeFrom(from.softsign());
      break;
    }
    case kSoftplus: {
      mutable_softplus()->::CoreML::Specification::ActivationSoftplus::MergeFrom(from.softplus());
      break;
    }
    case kParametricSoftplus: {
      mutable_parametricsoftplus()->::CoreML::Specification::ActivationParametricSoftplus::MergeFrom(from.parametricsoftplus());
      break;
    }
    case NONLINEARITYTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ActivationParams)
}